

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::addMorphTargets(Geometry *this,int32 n)

{
  int iVar1;
  int local_44;
  uint8 *puStack_40;
  int32 i;
  V3d *data;
  long lStack_30;
  uint32 len;
  uint8 *dst;
  uint8 *src;
  MorphTarget *mts;
  int32 sz;
  int32 n_local;
  Geometry *this_local;
  
  if (n != 0) {
    iVar1 = this->numMorphTargets + n;
    mts._0_4_ = 0x28;
    if (((this->flags & 0x1000000) == 0) &&
       (mts._0_4_ = this->numVertices * 0xc + 0x28, (this->flags & 0x10) != 0)) {
      mts._0_4_ = (int)mts + this->numVertices * 0xc;
    }
    if (this->numMorphTargets == 0) {
      src = (uint8 *)mustmalloc_LOC((long)(iVar1 * (int)mts),0x3000f,
                                    "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 323"
                                   );
      this->morphTargets = (MorphTarget *)src;
    }
    else {
      src = (uint8 *)mustrealloc_LOC(this->morphTargets,(long)(iVar1 * (int)mts),0x3000f,
                                     "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 314"
                                    );
      this->morphTargets = (MorphTarget *)src;
      data._4_4_ = ((int)mts + -0x28) * this->numMorphTargets;
      lStack_30 = (long)&((MorphTarget *)src)->parent + (long)((int)mts * iVar1);
      dst = (uint8 *)((long)&((MorphTarget *)src)->parent + (long)((int)mts * this->numMorphTargets)
                     );
      while (data._4_4_ != 0) {
        *(uint8 *)(lStack_30 + -1) = dst[-1];
        data._4_4_ = data._4_4_ + -1;
        lStack_30 = lStack_30 + -1;
        dst = dst + -1;
      }
    }
    puStack_40 = src + (long)iVar1 * 0x28;
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      *(Geometry **)src = this;
      src[0x18] = '\0';
      src[0x19] = '\0';
      src[0x1a] = '\0';
      src[0x1b] = '\0';
      src[0x1c] = '\0';
      src[0x1d] = '\0';
      src[0x1e] = '\0';
      src[0x1f] = '\0';
      src[0x20] = '\0';
      src[0x21] = '\0';
      src[0x22] = '\0';
      src[0x23] = '\0';
      src[0x24] = '\0';
      src[0x25] = '\0';
      src[0x26] = '\0';
      src[0x27] = '\0';
      if (this->numMorphTargets <= local_44) {
        src[8] = '\0';
        src[9] = '\0';
        src[10] = '\0';
        src[0xb] = '\0';
        src[0xc] = '\0';
        src[0xd] = '\0';
        src[0xe] = '\0';
        src[0xf] = '\0';
        src[0x10] = '\0';
        src[0x11] = '\0';
        src[0x12] = '\0';
        src[0x13] = '\0';
        src[0x14] = '\0';
        src[0x15] = '\0';
        src[0x16] = '\0';
        src[0x17] = '\0';
      }
      if (((this->flags & 0x1000000) == 0) && (this->numVertices != 0)) {
        *(uint8 **)(src + 0x18) = puStack_40;
        puStack_40 = puStack_40 + (long)this->numVertices * 0xc;
        if ((this->flags & 0x10) != 0) {
          *(uint8 **)(src + 0x20) = puStack_40;
          puStack_40 = puStack_40 + (long)this->numVertices * 0xc;
        }
      }
      src = src + 0x28;
    }
    this->numMorphTargets = iVar1;
  }
  return;
}

Assistant:

void
Geometry::addMorphTargets(int32 n)
{
	if(n == 0)
		return;
	n += this->numMorphTargets;

	int32 sz;
	sz = sizeof(MorphTarget);
	if(!(this->flags & NATIVE)){
		sz += this->numVertices*sizeof(V3d);
		if(this->flags & NORMALS)
			sz += this->numVertices*sizeof(V3d);
	}

	// Memory layout: MorphTarget[n]; (vertices and normals)[n]
	MorphTarget *mts;
	if(this->numMorphTargets){
		mts = (MorphTarget*)rwResize(this->morphTargets, n*sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->morphTargets = mts;
		// Since we now have more morph targets than before, move the vertex data up
		uint8 *src = (uint8*)mts + sz*this->numMorphTargets;
		uint8 *dst = (uint8*)mts + sz*n;
		uint32 len = (sz-sizeof(MorphTarget))*this->numMorphTargets;
		while(len--)
			*--dst = *--src;
	}else{
		mts = (MorphTarget*)rwNew(n*sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->morphTargets = mts;
	}

	// Set up everything and initialize the bounding sphere for new morph targets
	V3d *data  = (V3d*)&mts[n];
	for(int32 i = 0; i < n; i++){
		mts->parent = this;
		mts->vertices = nil;
		mts->normals = nil;
		if(i >= this->numMorphTargets){
			mts->boundingSphere.center.x = 0.0f;
			mts->boundingSphere.center.y = 0.0f;
			mts->boundingSphere.center.z = 0.0f;
			mts->boundingSphere.radius = 0.0f;
		}
		if(!(this->flags & NATIVE) && this->numVertices){
			mts->vertices = data;
			data += this->numVertices;
			if(this->flags & NORMALS){
				mts->normals = data;
				data += this->numVertices;
			}
		}
		mts++;
	}
	this->numMorphTargets = n;
}